

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-util.h
# Opt level: O2

string * __thiscall
wabt::cat<std::basic_string_view<char,std::char_traits<char>>,char[4]>
          (string *__return_storage_ptr__,wabt *this,
          basic_string_view<char,_std::char_traits<char>_> *args,char (*args_1) [4])

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cat_compute_size<std::basic_string_view<char,std::char_traits<char>>,char[4]>
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char (*) [4])args);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  cat_concatenate<std::basic_string_view<char,std::char_traits<char>>,char[4]>
            (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)this,
             (char (*) [4])args);
  return __return_storage_ptr__;
}

Assistant:

std::string cat(const Ts&... args) {
  std::string s;
  s.reserve(cat_compute_size(args...));
  cat_concatenate(s, args...);
  return s;
}